

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  sqlite3 *db_00;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  TriggerPrg *p;
  long lVar10;
  ulong uVar11;
  Vdbe *pVVar12;
  int *piVar13;
  size_t __n;
  bool bVar14;
  char *zErrMsg;
  int cookie;
  TriggerPrg *local_208;
  uint local_200;
  u32 local_1fc;
  ulong local_1f8;
  char *local_1f0;
  u64 local_1e8;
  sqlite3_stmt **local_1e0;
  Vdbe *local_1d8;
  Parse local_1d0;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1e0 = ppStmt;
  local_1d8 = pOld;
  iVar5 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar5 == 0)) {
    uVar6 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1e5eb,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    bVar3 = (byte)prepFlags;
    bVar4 = bVar3 >> 2 & 1;
    local_1f8 = (ulong)(uint)nBytes;
    local_1e8 = local_1f8 + 1;
    local_1f0 = zSql + local_1f8;
    uVar8 = CONCAT71((int7)((ulong)local_1f0 >> 8),1);
    do {
      local_200 = (uint)uVar8;
      do {
        local_208 = (TriggerPrg *)0x0;
        memset(&local_1d0,0,0xcc);
        memset(&local_1d0.sLastToken,0,0xa0);
        local_1d0.pReprepare = local_1d8;
        if ((prepFlags & 1) != 0) {
          local_1d0.disableLookaside = '\x01';
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        iVar5 = db->nDb;
        local_1d0.disableVtab = bVar4;
        if (0 < iVar5) {
          lVar10 = 0;
          lVar9 = 0;
          do {
            pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar10);
            if (pBVar2 != (Btree *)0x0) {
              if ((pBVar2->sharable != '\0') &&
                 (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
                btreeLockCarefully(pBVar2);
              }
              uVar6 = querySharedCacheTableLock(pBVar2,1,'\x01');
              if (pBVar2->sharable != '\0') {
                piVar13 = &pBVar2->wantToLock;
                *piVar13 = *piVar13 + -1;
                if (*piVar13 == 0) {
                  unlockBtreeMutex(pBVar2);
                }
              }
              if (uVar6 != 0) {
                sqlite3ErrorWithMsg(db,uVar6,"database schema is locked: %s",
                                    *(undefined8 *)((long)&db->aDb->zDbSName + lVar10));
                goto LAB_001276eb;
              }
              iVar5 = db->nDb;
            }
            lVar9 = lVar9 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar9 < iVar5);
        }
        sqlite3VtabUnlockList(db);
        local_1d0.db = db;
        if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_1f8 - 1] == '\0')))) {
          sqlite3RunParser(&local_1d0,zSql,(char **)&local_208);
LAB_0012742e:
          db_00 = local_1d0.db;
          if (local_1d0.rc == 0x65) {
            local_1d0.rc = 0;
          }
          if ((local_1d0.checkSchema != '\0') && (0 < (local_1d0.db)->nDb)) {
            lVar9 = 0;
            lVar10 = 0;
            do {
              pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar9);
              if (pBVar2 != (Btree *)0x0) {
                uVar1 = pBVar2->inTrans;
                if ((uVar1 == '\0') &&
                   (iVar5 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar5 != 0)) {
                  if ((iVar5 == 0xc0a) || (iVar5 == 7)) {
                    sqlite3OomFault(db_00);
                  }
                  break;
                }
                sqlite3BtreeGetMeta(pBVar2,1,&local_1fc);
                if (local_1fc != **(u32 **)((long)&db_00->aDb->pSchema + lVar9)) {
                  sqlite3ResetOneSchema(db_00,(int)lVar10);
                  local_1d0.rc = 0x11;
                }
                if (uVar1 == '\0') {
                  sqlite3BtreeCommit(pBVar2);
                }
              }
              lVar10 = lVar10 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar10 < db_00->nDb);
          }
          if (db->mallocFailed != '\0') {
            local_1d0.rc = 7;
          }
          uVar6 = local_1d0.rc;
          if (pzTail != (char **)0x0) {
            *pzTail = local_1d0.zTail;
          }
          if ((local_1d0.explain != '\0' && local_1d0.pVdbe != (Vdbe *)0x0) && local_1d0.rc == 0) {
            bVar14 = local_1d0.explain == '\x02';
            uVar11 = (ulong)((uint)bVar14 * 8);
            sqlite3VdbeSetNumCols(local_1d0.pVdbe,(uint)!bVar14 * 4 + 4);
            piVar13 = (int *)(sqlite3Prepare_azColName_rel + (ulong)bVar14 * 0x20);
            lVar9 = 0;
            do {
              if ((local_1d0.pVdbe)->db->mallocFailed == '\0') {
                sqlite3VdbeMemSetStr
                          ((Mem *)((long)&(local_1d0.pVdbe)->aColName->u + lVar9),
                           sqlite3Prepare_azColName_rel + *piVar13,-1,'\x01',
                           (_func_void_void_ptr *)0x0);
              }
              uVar11 = uVar11 + 1;
              piVar13 = piVar13 + 1;
              lVar9 = lVar9 + 0x38;
            } while (uVar11 < (ulong)bVar14 * 4 + 8);
          }
          pVVar12 = local_1d0.pVdbe;
          if ((db->init).busy == '\0') {
            if (local_1d0.pVdbe != (Vdbe *)0x0) {
              (local_1d0.pVdbe)->prepFlags = bVar3;
              if (-1 < (char)bVar3) {
                (local_1d0.pVdbe)->expmask = 0;
              }
              __n = (size_t)((int)local_1d0.zTail - (int)zSql);
              pcVar7 = (char *)sqlite3DbMallocRawNN((local_1d0.pVdbe)->db,__n + 1);
              if (pcVar7 != (char *)0x0) {
                memcpy(pcVar7,zSql,__n);
                pcVar7[__n] = '\0';
              }
              pVVar12->zSql = pcVar7;
              goto LAB_0012764d;
            }
            pVVar12 = (Vdbe *)0x0;
LAB_00127679:
            *local_1e0 = (sqlite3_stmt *)pVVar12;
          }
          else {
LAB_0012764d:
            if (local_1d0.pVdbe == (Vdbe *)0x0) {
              pVVar12 = (Vdbe *)0x0;
              goto LAB_00127679;
            }
            if ((uVar6 == 0) && (pVVar12 = local_1d0.pVdbe, db->mallocFailed == '\0'))
            goto LAB_00127679;
            sqlite3VdbeFinalize(local_1d0.pVdbe);
          }
          p = local_208;
          if (local_208 == (TriggerPrg *)0x0) {
            db->errCode = uVar6;
            if ((uVar6 == 0) && (db->pErr == (sqlite3_value *)0x0)) goto LAB_001276c8;
            sqlite3ErrorFinish(db,uVar6);
            goto LAB_001276c8;
          }
          sqlite3ErrorWithMsg(db,uVar6,"%s",local_208);
          while( true ) {
            sqlite3DbFreeNN(db,p);
LAB_001276c8:
            if (local_1d0.pTriggerPrg == (TriggerPrg *)0x0) break;
            p = local_1d0.pTriggerPrg;
            local_1d0.pTriggerPrg = (local_1d0.pTriggerPrg)->pNext;
          }
        }
        else {
          if (nBytes <= db->aLimit[1]) {
            pcVar7 = (char *)sqlite3DbMallocRawNN(db,local_1e8);
            uVar11 = local_1f8;
            if (pcVar7 == (char *)0x0) {
              local_1d0.zTail = local_1f0;
            }
            else {
              memcpy(pcVar7,zSql,local_1f8);
              pcVar7[uVar11] = '\0';
              sqlite3RunParser(&local_1d0,pcVar7,(char **)&local_208);
              local_1d0.zTail = zSql + ((long)local_1d0.zTail - (long)pcVar7);
              sqlite3DbFreeNN(db,pcVar7);
            }
            goto LAB_0012742e;
          }
          sqlite3ErrorWithMsg(db,0x12,"statement too long");
          if (db->mallocFailed != '\0') {
            apiOomError(db);
            sqlite3ParserReset(&local_1d0);
            uVar6 = 7;
            goto LAB_0012778b;
          }
          uVar6 = db->errMask & 0x12;
        }
LAB_001276eb:
        sqlite3ParserReset(&local_1d0);
      } while (uVar6 == 0x201);
      if (uVar6 != 0x11) {
LAB_0012778b:
        if (db->noSharedCache == '\0') {
          btreeLeaveAll(db);
        }
        if ((uVar6 == 0xc0a) || (db->mallocFailed != '\0')) goto LAB_001277ae;
        uVar6 = uVar6 & db->errMask;
        goto LAB_001277bc;
      }
      sqlite3ResetOneSchema(db,-1);
      uVar8 = 0;
    } while ((local_200 & 1) != 0);
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if (db->mallocFailed == '\0') {
      uVar6 = db->errMask & 0x11;
    }
    else {
LAB_001277ae:
      apiOomError(db);
      uVar6 = 7;
    }
LAB_001277bc:
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar6;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}